

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strs.c
# Opt level: O0

int nni_strncasecmp(char *s1,char *s2,size_t n)

{
  int iVar1;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  iVar1 = strncasecmp(s1,s2,n);
  return iVar1;
}

Assistant:

int
nni_strncasecmp(const char *s1, const char *s2, size_t n)
{
#if defined(_WIN32)
	return (_strnicmp(s1, s2, n));
#elif defined(NNG_HAVE_STRNCASECMP)
	return (strncasecmp(s1, s2, n));
#else
	for (int i = 0; i < n; i++) {
		uint8_t c1 = (uint8_t) tolower(*s1++);
		uint8_t c2 = (uint8_t) tolower(*s2++);
		if (c1 == c2) {
			if (c1 == 0) {
				return (0);
			}
			continue;
		}
		return ((c1 < c2) ? -1 : 1);
	}
	return (0);
#endif
}